

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

void __thiscall
entt::basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::in_place_pop
          (basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *this,entity entt)

{
  entity_type eVar1;
  entity eVar2;
  reference pvVar3;
  value_type local_2c;
  ulong local_28;
  size_type pos;
  entity *ref;
  basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *pbStack_10;
  entity entt_local;
  basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *this_local;
  
  ref._4_4_ = entt;
  pbStack_10 = this;
  pos = (size_type)sparse_ref(this,entt);
  eVar1 = entt_traits<entt::entity>::to_entity(*(value_type *)pos);
  local_28 = (ulong)eVar1;
  pvVar3 = std::vector<entt::entity,_std::allocator<entt::entity>_>::operator[]
                     (&this->packed,local_28);
  if (*pvVar3 == ref._4_4_) {
    local_2c = entt_traits<entt::entity>::combine((entity_type)local_28,0xffffffff);
    eVar2 = std::exchange<entt::entity,entt::entity>(&this->free_list,&local_2c);
    pvVar3 = std::vector<entt::entity,_std::allocator<entt::entity>_>::operator[]
                       (&this->packed,local_28);
    *pvVar3 = eVar2;
    eVar2 = null_t::operator_cast_to_entity((null_t *)&null);
    *(entity *)pos = eVar2;
    return;
  }
  __assert_fail("packed[pos] == entt",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/entt/./single_include/entt/entt.hpp"
                ,0x32f9,
                "virtual void entt::basic_sparse_set<entt::entity>::in_place_pop(const Entity) [Entity = entt::entity]"
               );
}

Assistant:

virtual void in_place_pop(const Entity entt) {
        auto &ref = sparse_ref(entt);
        const auto pos = static_cast<size_type>(entity_traits::to_entity(ref));
        ENTT_ASSERT(packed[pos] == entt, "Invalid identifier");

        packed[pos] = std::exchange(free_list, entity_traits::combine(static_cast<typename entity_traits::entity_type>(pos), entity_traits::reserved));
        // lazy self-assignment guard
        ref = null;
    }